

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyDictionary.h
# Opt level: O0

PropertyDictionary * __thiscall
Rml::PropertyDictionary::operator=(PropertyDictionary *this,PropertyDictionary *param_1)

{
  PropertyDictionary *param_1_local;
  PropertyDictionary *this_local;
  
  robin_hood::detail::
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  ::operator=(&this->properties,&param_1->properties);
  return this;
}

Assistant:

class RMLUICORE_API PropertyDictionary {
public:
	PropertyDictionary();

	/// Sets a property on the dictionary. Any existing property with the same id will be overwritten.
	void SetProperty(PropertyId id, const Property& property);
	/// Removes a property from the dictionary, if it exists.
	void RemoveProperty(PropertyId id);
	/// Returns the value of the property with the requested id, if one exists.
	const Property* GetProperty(PropertyId id) const;

	/// Returns the number of properties in the dictionary.
	int GetNumProperties() const;
	/// Returns the map of properties in the dictionary.
	const PropertyMap& GetProperties() const;

	/// Imports into the dictionary, and optionally defines the specificity of, potentially
	/// un-specified properties. In the case of id conflicts, the incoming properties will
	/// overwrite the existing properties if their specificity (or their forced specificity)
	/// are at least equal.
	/// @param[in] property_dictionary The properties to import.
	/// @param[in] specificity The specificity for all incoming properties. If this is not specified, the properties will keep their original
	/// specificity.
	void Import(const PropertyDictionary& property_dictionary, int specificity = -1);

	/// Merges the contents of another fully-specified property dictionary with this one.
	/// Properties defined in the new dictionary will overwrite those with the same id as
	/// appropriate.
	/// @param[in] property_dictionary The dictionary to merge.
	/// @param[in] specificity_offset The specificities of all incoming properties will be offset by this value.
	void Merge(const PropertyDictionary& property_dictionary, int specificity_offset = 0);

	/// Set the source of all properties in the dictionary to the given one.
	void SetSourceOfAllProperties(const SharedPtr<const PropertySource>& property_source);

private:
	// Sets a property on the dictionary and its specificity if there is no name conflict, or its
	// specificity (given by the parameter, not read from the property itself) is at least equal to
	// the specificity of the conflicting property.
	void SetProperty(PropertyId id, const Property& property, int specificity);

	PropertyMap properties;
}